

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedBools::_internal_add_values
          (TensorValue_RepeatedBools *this,bool value)

{
  bool local_1;
  
  google::protobuf::RepeatedField<bool>::Add(&this->values_,&local_1);
  return;
}

Assistant:

inline void TensorValue_RepeatedBools::_internal_add_values(bool value) {
  values_.Add(value);
}